

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::Clear(SDES *this)

{
  list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->sdessources;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    RTPDelete<jrtplib::RTCPCompoundPacketBuilder::SDESSource>
              ((SDESSource *)p_Var1[1]._M_next,(this->super_RTPMemoryObject).mgr);
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  ::clear(this_00);
  return;
}

Assistant:

void Clear()
		{
			std::list<SDESSource *>::const_iterator it;

			for (it = sdessources.begin() ; it != sdessources.end() ; it++)
				RTPDelete(*it,GetMemoryManager());
			sdessources.clear();
		}